

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::replace_extension(path *this,path *new_extension)

{
  size_type sVar1;
  path local_40;
  
  sVar1 = (this->m_pathname)._M_string_length;
  extension(&local_40,this);
  std::__cxx11::string::erase((ulong)this,sVar1 - local_40.m_pathname._M_string_length);
  std::__cxx11::string::~string((string *)&local_40);
  if ((new_extension->m_pathname)._M_string_length != 0) {
    if (*(new_extension->m_pathname)._M_dataplus._M_p != '.') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::append((string *)this);
  }
  return this;
}

Assistant:

path& path::replace_extension(const path& new_extension)
  {
    // erase existing extension, including the dot, if any
    m_pathname.erase(m_pathname.size()-extension().m_pathname.size());

    if (!new_extension.empty())
    {
      // append new_extension, adding the dot if necessary
      if (new_extension.m_pathname[0] != dot)
        m_pathname.push_back(dot);
      m_pathname.append(new_extension.m_pathname);
    }

    return *this;
  }